

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O2

void __thiscall
wasm::StructUtils::StructValuesMap<wasm::LUBFinder>::combineInto
          (StructValuesMap<wasm::LUBFinder> *this,StructValuesMap<wasm::LUBFinder> *combinedInfos)

{
  uint uVar1;
  StructValues<wasm::LUBFinder> *this_00;
  LUBFinder *this_01;
  LUBFinder *other;
  ulong index;
  __node_base *p_Var2;
  
  p_Var2 = &(this->
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
            )._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    for (uVar1 = 0; index = (ulong)uVar1,
        index < (ulong)((long)p_Var2[3]._M_nxt -
                        (long)*(_Hash_node_base **)
                               &((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor >> 3);
        uVar1 = uVar1 + 1) {
      this_00 = operator[](combinedInfos,(HeapType)p_Var2[1]._M_nxt);
      this_01 = StructValues<wasm::LUBFinder>::operator[](this_00,index);
      other = StructValues<wasm::LUBFinder>::operator[]
                        ((StructValues<wasm::LUBFinder> *)(p_Var2 + 2),index);
      LUBFinder::combine(this_01,other);
    }
  }
  return;
}

Assistant:

void combineInto(StructValuesMap<T>& combinedInfos) const {
    for (auto& [type, info] : *this) {
      for (Index i = 0; i < info.size(); i++) {
        combinedInfos[type][i].combine(info[i]);
      }
    }
  }